

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

CP_MAPPING * CODEPAGEGetData(UINT CodePage)

{
  bool bVar1;
  UINT nIndex;
  UINT nSize;
  UINT CodePage_local;
  
  bVar1 = false;
  nIndex = CodePage;
  if (CodePage == 0) {
    nIndex = 0xfde9;
  }
  while( true ) {
    if (bVar1) {
      return (CP_MAPPING *)0x0;
    }
    if (nIndex == 0xfde9) break;
    bVar1 = true;
  }
  return CP_TO_NATIVE_TABLE;
}

Assistant:

const CP_MAPPING *
CODEPAGEGetData( IN UINT CodePage )
{
    UINT nSize = sizeof( CP_TO_NATIVE_TABLE ) / sizeof( CP_TO_NATIVE_TABLE[ 0 ] );
    UINT nIndex = 0;

    if ( CP_ACP == CodePage )
    {
        CodePage = PAL_ACP;
    }

    /* checking if the CodePage is ACP and returning true if so */
    while (nIndex < nSize)
    {
        if ( ( CP_TO_NATIVE_TABLE[ nIndex ] ).nCodePage == CodePage )
        {
            return &(CP_TO_NATIVE_TABLE[ nIndex ]);
        }
        nIndex++;
    }
    return NULL;
}